

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

void __thiscall Engine::Incr<Tag,Tag>(Engine *this,string *name,Tag *tags,Tag *tags_1)

{
  long lVar1;
  vector<Tag,_std::allocator<Tag>_> tv;
  vector<Tag,_std::allocator<Tag>_> local_c8;
  MetricType local_a8 [2];
  Tag local_a0 [2];
  
  local_c8.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Tag::Tag(local_a0,tags);
  Tag::Tag(local_a0 + 1,tags_1);
  std::vector<Tag,_std::allocator<Tag>_>::push_back(&local_c8,local_a0);
  std::vector<Tag,_std::allocator<Tag>_>::push_back(&local_c8,local_a0 + 1);
  lVar1 = 0x40;
  do {
    Tag::~Tag((Tag *)((long)&local_a0[0].name._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  local_a0[0].name._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
  local_a8[1] = 1;
  local_a8[0] = Counter;
  measure<int,_nullptr>
            (this,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)local_a0,name,(int *)(local_a8 + 1),local_a8,&local_c8);
  std::vector<Tag,_std::allocator<Tag>_>::~vector(&local_c8);
  return;
}

Assistant:

void Incr(const std::string &name, Ts... tags) {
        std::vector<Tag> tv;
        for (const auto& x : {tags...}) {
            //Tag t = static_cast<Tag>(static_cast<const Tag>(x));
            tv.push_back(x);
        }
        measure(system_clock::now(), name, 1, Counter, tv);
    }